

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O2

void rsg::ValueRange::computeIntersection
               (ValueRange *dst,ConstValueRangeAccess *a,ConstValueRangeAccess *b)

{
  ValueRangeAccess dst_00;
  Scalar *pSVar1;
  Scalar *pSVar2;
  
  pSVar1 = (dst->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (dst->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar1 == (dst->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pSVar1 = (Scalar *)0x0;
  }
  if (pSVar2 == (dst->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pSVar2 = (Scalar *)0x0;
  }
  dst_00.super_ConstValueRangeAccess.m_min = pSVar1;
  dst_00.super_ConstValueRangeAccess.m_type = &dst->m_type;
  dst_00.super_ConstValueRangeAccess.m_max = pSVar2;
  computeIntersection(dst_00,a,b);
  return;
}

Assistant:

void ValueRange::computeIntersection (ValueRange& dst, const ConstValueRangeAccess& a, const ConstValueRangeAccess& b)
{
	computeIntersection(dst.asAccess(), a, b);
}